

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O3

void __thiscall
irr::gui::CGUIEnvironment::CGUIEnvironment
          (CGUIEnvironment *this,IFileSystem *fs,IVideoDriver *driver,IOSOperator *op)

{
  int *piVar1;
  long lVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar3;
  int iVar4;
  int iVar5;
  rect<int> local_40;
  
  *(undefined8 *)&this->field_0x210 = 0;
  *(undefined4 *)&this->field_0x218 = 1;
  (this->super_IGUIEnvironment)._vptr_IGUIEnvironment = (_func_int **)0x26e020;
  *(undefined8 *)&this->field_0x208 = 0x26e180;
  iVar4 = 0;
  iVar5 = 0;
  if (driver != (IVideoDriver *)0x0) {
    iVar5 = (*driver->_vptr_IVideoDriver[0x3b])(driver);
    iVar4 = (int)*(undefined8 *)CONCAT44(extraout_var,iVar5);
    iVar5 = (int)((ulong)*(undefined8 *)CONCAT44(extraout_var,iVar5) >> 0x20);
  }
  local_40.UpperLeftCorner.X = 0;
  local_40.UpperLeftCorner.Y = 0;
  local_40.LowerRightCorner.Y = iVar5;
  local_40.LowerRightCorner.X = iVar4;
  IGUIElement::IGUIElement
            ((IGUIElement *)&(this->super_IGUIEnvironment).field_0x8,
             &PTR_construction_vtable_24__0026dfe8,EGUIET_ROOT,(IGUIEnvironment *)0x0,
             (IGUIElement *)0x0,0,&local_40);
  (this->super_IGUIEnvironment)._vptr_IGUIEnvironment = (_func_int **)0x26dd18;
  *(undefined8 *)&this->field_0x208 = 0x26dfc0;
  *(undefined8 *)&(this->super_IGUIEnvironment).field_0x8 = 0x26de88;
  (this->Fonts).m_data.
  super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Fonts).m_data.
  super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Fonts).m_data.
  super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Fonts).is_sorted = true;
  (this->Banks).m_data.
  super__Vector_base<irr::gui::CGUIEnvironment::SSpriteBank,_std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Banks).m_data.
  super__Vector_base<irr::gui::CGUIEnvironment::SSpriteBank,_std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Banks).m_data.
  super__Vector_base<irr::gui::CGUIEnvironment::SSpriteBank,_std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Banks).is_sorted = true;
  this->Driver = driver;
  this->Hovered = (IGUIElement *)0x0;
  this->HoveredNoSubelement = (IGUIElement *)0x0;
  this->Focus = (IGUIElement *)0x0;
  (this->LastHoveredMousePos).X = 0;
  (this->LastHoveredMousePos).Y = 0;
  this->CurrentSkin = (IGUISkin *)0x0;
  this->FileSystem = fs;
  this->UserReceiver = (IEventReceiver *)0x0;
  this->Operator = op;
  this->FocusFlags = 9;
  (this->DeletionQueue).m_data.
  super__Vector_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->DeletionQueue).m_data.
  super__Vector_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->DeletionQueue).m_data.
  super__Vector_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->DeletionQueue).is_sorted = true;
  if (driver != (IVideoDriver *)0x0) {
    *(int *)(&driver->field_0x10 + (long)driver->_vptr_IVideoDriver[-3]) =
         *(int *)(&driver->field_0x10 + (long)driver->_vptr_IVideoDriver[-3]) + 1;
  }
  if (fs != (IFileSystem *)0x0) {
    *(int *)(&fs->field_0x10 + (long)fs->_vptr_IFileSystem[-3]) =
         *(int *)(&fs->field_0x10 + (long)fs->_vptr_IFileSystem[-3]) + 1;
  }
  if (op != (IOSOperator *)0x0) {
    *(int *)(&op->field_0x10 + (long)op->_vptr_IOSOperator[-3]) =
         *(int *)(&op->field_0x10 + (long)op->_vptr_IOSOperator[-3]) + 1;
  }
  loadBuiltInFont(this);
  iVar4 = (*(this->super_IGUIEnvironment)._vptr_IGUIEnvironment[0xe])(this,1);
  plVar3 = (long *)CONCAT44(extraout_var_00,iVar4);
  (*(this->super_IGUIEnvironment)._vptr_IGUIEnvironment[0xd])(this,plVar3);
  lVar2 = *(long *)(*plVar3 + -0x18);
  piVar1 = (int *)((long)plVar3 + lVar2 + 0x10);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    plVar3 = (long *)((long)plVar3 + lVar2);
    (**(code **)(*plVar3 + 8))(plVar3);
  }
  (this->ToolTip).LastTime = 0;
  (this->ToolTip).EnterTime = 0;
  (this->ToolTip).LaunchTime = 1000;
  (this->ToolTip).RelaunchTime = 500;
  (this->ToolTip).Element = (IGUIStaticText *)0x0;
  *(CGUIEnvironment **)&this->field_0x130 = this;
  this->field_0x11c = 1;
  return;
}

Assistant:

CGUIEnvironment::CGUIEnvironment(io::IFileSystem *fs, video::IVideoDriver *driver, IOSOperator *op) :
		IGUIElement(EGUIET_ROOT, 0, 0, 0, core::rect<s32>(driver ? core::dimension2d<s32>(driver->getScreenSize()) : core::dimension2d<s32>(0, 0))),
		Driver(driver), Hovered(0), HoveredNoSubelement(0), Focus(0), LastHoveredMousePos(0, 0), CurrentSkin(0),
		FileSystem(fs), UserReceiver(0), Operator(op), FocusFlags(EFF_SET_ON_LMOUSE_DOWN | EFF_SET_ON_TAB)
{
	if (Driver)
		Driver->grab();

	if (FileSystem)
		FileSystem->grab();

	if (Operator)
		Operator->grab();

#ifdef _DEBUG
	IGUIEnvironment::setDebugName("CGUIEnvironment");
#endif

	loadBuiltInFont();

	IGUISkin *skin = createSkin(gui::EGST_WINDOWS_METALLIC);
	setSkin(skin);
	skin->drop();

	// set tooltip default
	ToolTip.LastTime = 0;
	ToolTip.EnterTime = 0;
	ToolTip.LaunchTime = 1000;
	ToolTip.RelaunchTime = 500;
	ToolTip.Element = 0;

	// environment is root tab group
	Environment = this;
	setTabGroup(true);
}